

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

void __thiscall
H264StreamReader::checkPyramid
          (H264StreamReader *this,int frameNum,int *fullPicOrder,bool nextFrameFound)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = 3;
  if (frameNum - *fullPicOrder < 3) {
    iVar1 = frameNum - *fullPicOrder;
  }
  if (this->m_frameDepth < iVar1) {
    if (nextFrameFound) {
      this->m_frameDepth = iVar1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"B-pyramid level ",0x10);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->m_frameDepth + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," detected. Shift DTS to ",0x18);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_frameDepth);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," frames",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      sLastMsg = true;
    }
    else {
      *fullPicOrder = frameNum - this->m_frameDepth;
    }
  }
  return;
}

Assistant:

void H264StreamReader::checkPyramid(const int frameNum, int *fullPicOrder, const bool nextFrameFound)
{
    int depth = frameNum - *fullPicOrder;
    if (depth > 3)
        depth = 3;  // prevent large delay. It is not to be happend in normanl stream, but this protection for invalid
                    // streams.
    if (depth > m_frameDepth)
    {
        if (nextFrameFound)
        {
            m_frameDepth = depth;
            LTRACE(LT_INFO, 2,
                   "B-pyramid level " << m_frameDepth - 1 << " detected. Shift DTS to " << m_frameDepth << " frames");
        }
        else
        {
            *fullPicOrder = frameNum - m_frameDepth;  // special case for last frame
        }
    }
}